

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZConsWriter.cpp
# Opt level: O0

void __thiscall
OpenMD::ZConsWriter::writeFZ
          (ZConsWriter *this,
          list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *fixedZmols)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  pointer pZVar6;
  SnapshotManager *this_00;
  Snapshot *this_01;
  void *pvVar7;
  pointer pZVar8;
  ostream *poVar9;
  undefined8 *in_RDI;
  RealType RVar10;
  const_iterator j_1;
  iterator l;
  int k;
  const_iterator j;
  int i;
  ZconsData tmpData;
  vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> zconsData;
  RealType data [3];
  int zmolIndex;
  MPI_Status ierr;
  vector<int,_std::allocator<int>_> nFixedZmolsInProc;
  vector<int,_std::allocator<int>_> tmpNFixedZmols;
  int myNode;
  int nproc;
  int primaryNode;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *in_stack_fffffffffffffdd8;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *in_stack_fffffffffffffdf0;
  size_type in_stack_fffffffffffffdf8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe00;
  _Self local_138;
  _List_node_base *local_130;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> local_128;
  __normal_iterator<OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
  local_110;
  int local_104;
  _Self local_100;
  _List_node_base *local_f8;
  _List_const_iterator<OpenMD::ZconstraintMol> local_f0;
  int local_e4;
  int local_e0;
  RealType local_d8;
  RealType local_d0;
  RealType local_c8;
  vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> local_c0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  int local_8c;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> local_88;
  undefined4 local_6c;
  vector<int,_std::allocator<int>_> local_68;
  undefined4 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  int local_1c;
  int local_18 [6];
  
  local_18[1] = 0;
  MPI_Comm_size(&ompi_mpi_comm_world,local_18);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_1c);
  local_3c = 0;
  std::allocator<int>::allocator((allocator<int> *)0x198ac3);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (value_type_conflict2 *)in_stack_fffffffffffffdf0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::allocator<int>::~allocator((allocator<int> *)0x198af7);
  local_6c = 0;
  std::allocator<int>::allocator((allocator<int> *)0x198b27);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (value_type_conflict2 *)in_stack_fffffffffffffdf0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  std::allocator<int>::~allocator((allocator<int> *)0x198b5b);
  sVar3 = std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::size
                    (in_stack_fffffffffffffde0);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_1c);
  *pvVar4 = (value_type)sVar3;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,0);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,0);
  MPI_Allreduce(pvVar4,pvVar5,local_18[0],&ompi_mpi_int,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  if (local_1c == 0) {
    std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::vector
              ((vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *)0x198c14);
    for (local_e4 = 0; local_e4 < local_18[0]; local_e4 = local_e4 + 1) {
      if (local_e4 == 0) {
        std::_List_const_iterator<OpenMD::ZconstraintMol>::_List_const_iterator(&local_f0);
        local_f8 = (_List_node_base *)
                   std::__cxx11::
                   list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::begin
                             (in_stack_fffffffffffffdd8);
        local_f0._M_node = local_f8;
        while( true ) {
          local_100._M_node =
               (_List_node_base *)
               std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
               end(in_stack_fffffffffffffdd8);
          bVar2 = std::operator!=(&local_f0,&local_100);
          if (!bVar2) break;
          pZVar6 = std::_List_const_iterator<OpenMD::ZconstraintMol>::operator->
                             ((_List_const_iterator<OpenMD::ZconstraintMol> *)
                              in_stack_fffffffffffffde0);
          local_e0 = Molecule::getGlobalIndex(pZVar6->mol);
          pZVar6 = std::_List_const_iterator<OpenMD::ZconstraintMol>::operator->
                             ((_List_const_iterator<OpenMD::ZconstraintMol> *)
                              in_stack_fffffffffffffde0);
          local_d8 = pZVar6->fz;
          pZVar6 = std::_List_const_iterator<OpenMD::ZconstraintMol>::operator->
                             ((_List_const_iterator<OpenMD::ZconstraintMol> *)
                              in_stack_fffffffffffffde0);
          local_d0 = pZVar6->zpos;
          pZVar6 = std::_List_const_iterator<OpenMD::ZconstraintMol>::operator->
                             ((_List_const_iterator<OpenMD::ZconstraintMol> *)
                              in_stack_fffffffffffffde0);
          local_c8 = (pZVar6->param).zTargetPos;
          std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::push_back
                    (in_stack_fffffffffffffdf0,
                     (value_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          std::_List_const_iterator<OpenMD::ZconstraintMol>::operator++(&local_f0);
        }
      }
      else {
        for (local_104 = 0; iVar1 = local_104,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_68,(long)local_e4),
            iVar1 < *pvVar4; local_104 = local_104 + 1) {
          MPI_Recv(&local_8c,1,&ompi_mpi_int,local_e4,0,&ompi_mpi_comm_world,&local_88);
          in_stack_fffffffffffffdd8 = &local_88;
          MPI_Recv(&local_a8,3,&ompi_mpi_double,local_e4,0,&ompi_mpi_comm_world);
          local_e0 = local_8c;
          local_d8 = local_a8;
          local_d0 = local_a0;
          local_c8 = local_98;
          std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::push_back
                    (in_stack_fffffffffffffdf0,
                     (value_type *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        }
      }
    }
    this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
    this_01 = SnapshotManager::getCurrentSnapshot(this_00);
    RVar10 = Snapshot::getTime(this_01);
    pvVar7 = (void *)std::ostream::operator<<(in_RDI + 1,RVar10);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    sVar3 = std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::size(&local_c0);
    pvVar7 = (void *)std::ostream::operator<<(in_RDI + 1,sVar3);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
    ::__normal_iterator(&local_110);
    local_128.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
    _M_impl._M_node._M_size =
         (size_t)std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::begin
                           ((vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *)
                            in_stack_fffffffffffffdd8);
    local_110._M_current =
         (ZconsData *)
         local_128.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>
         ._M_impl._M_node._M_size;
    while( true ) {
      local_128.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
      _M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::end
                     ((vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *)
                      in_stack_fffffffffffffdd8);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
                          *)in_stack_fffffffffffffde0,
                         (__normal_iterator<OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
                          *)in_stack_fffffffffffffdd8);
      if (!bVar2) break;
      pZVar8 = __gnu_cxx::
               __normal_iterator<OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
               ::operator->(&local_110);
      poVar9 = (ostream *)std::ostream::operator<<(in_RDI + 1,pZVar8->zmolIndex);
      poVar9 = std::operator<<(poVar9,"\t");
      pZVar8 = __gnu_cxx::
               __normal_iterator<OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
               ::operator->(&local_110);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pZVar8->zforce);
      poVar9 = std::operator<<(poVar9,"\t");
      pZVar8 = __gnu_cxx::
               __normal_iterator<OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
               ::operator->(&local_110);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,pZVar8->zpos);
      poVar9 = std::operator<<(poVar9,"\t");
      pZVar8 = __gnu_cxx::
               __normal_iterator<OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
               ::operator->(&local_110);
      in_stack_fffffffffffffdf0 =
           (vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_> *)
           std::ostream::operator<<(poVar9,pZVar8->zconsPos);
      std::ostream::operator<<(in_stack_fffffffffffffdf0,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<OpenMD::ZconsData_*,_std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>_>
      ::operator++(&local_110);
    }
    std::vector<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>::~vector
              (in_stack_fffffffffffffdf0);
  }
  else {
    std::_List_const_iterator<OpenMD::ZconstraintMol>::_List_const_iterator
              ((_List_const_iterator<OpenMD::ZconstraintMol> *)&local_128);
    local_130 = (_List_node_base *)
                std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>
                ::begin(in_stack_fffffffffffffdd8);
    local_128.super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
    _M_impl._M_node.super__List_node_base._M_next = local_130;
    while( true ) {
      local_138._M_node =
           (_List_node_base *)
           std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                     (in_stack_fffffffffffffdd8);
      bVar2 = std::operator!=((_Self *)&local_128,&local_138);
      if (!bVar2) break;
      pZVar6 = std::_List_const_iterator<OpenMD::ZconstraintMol>::operator->
                         ((_List_const_iterator<OpenMD::ZconstraintMol> *)in_stack_fffffffffffffde0)
      ;
      local_8c = Molecule::getGlobalIndex(pZVar6->mol);
      in_stack_fffffffffffffde0 = &local_128;
      pZVar6 = std::_List_const_iterator<OpenMD::ZconstraintMol>::operator->
                         ((_List_const_iterator<OpenMD::ZconstraintMol> *)in_stack_fffffffffffffde0)
      ;
      local_a8 = pZVar6->fz;
      pZVar6 = std::_List_const_iterator<OpenMD::ZconstraintMol>::operator->
                         ((_List_const_iterator<OpenMD::ZconstraintMol> *)in_stack_fffffffffffffde0)
      ;
      local_a0 = pZVar6->zpos;
      pZVar6 = std::_List_const_iterator<OpenMD::ZconstraintMol>::operator->
                         ((_List_const_iterator<OpenMD::ZconstraintMol> *)in_stack_fffffffffffffde0)
      ;
      local_98 = (pZVar6->param).zTargetPos;
      MPI_Send(&local_8c,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
      MPI_Send(&local_a8,3,&ompi_mpi_double,0,0,&ompi_mpi_comm_world);
      std::_List_const_iterator<OpenMD::ZconstraintMol>::operator++
                ((_List_const_iterator<OpenMD::ZconstraintMol> *)&local_128);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void ZConsWriter::writeFZ(const std::list<ZconstraintMol>& fixedZmols) {
#ifndef IS_MPI
    output_ << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
            << std::endl;
    output_ << fixedZmols.size() << std::endl;

    std::list<ZconstraintMol>::const_iterator i;
    for (i = fixedZmols.begin(); i != fixedZmols.end(); ++i) {
      output_ << i->mol->getGlobalIndex() << "\t" << i->fz << "\t" << i->zpos
              << "\t" << i->param.zTargetPos << std::endl;
    }
#else

    const int primaryNode = 0;
    int nproc;
    int myNode;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);
    MPI_Comm_rank(MPI_COMM_WORLD, &myNode);

    std::vector<int> tmpNFixedZmols(nproc, 0);
    std::vector<int> nFixedZmolsInProc(nproc, 0);
    tmpNFixedZmols[myNode] = fixedZmols.size();

    // do MPI_ALLREDUCE to exchange the total number of atoms,
    // rigidbodies and cutoff groups
    MPI_Allreduce(&tmpNFixedZmols[0], &nFixedZmolsInProc[0], nproc, MPI_INT,
                  MPI_SUM, MPI_COMM_WORLD);

    MPI_Status ierr;
    int zmolIndex;
    RealType data[3];

    if (myNode == primaryNode) {
      std::vector<ZconsData> zconsData;
      ZconsData tmpData;
      for (int i = 0; i < nproc; ++i) {
        if (i == primaryNode) {
          std::list<ZconstraintMol>::const_iterator j;
          for (j = fixedZmols.begin(); j != fixedZmols.end(); ++j) {
            tmpData.zmolIndex = j->mol->getGlobalIndex();
            tmpData.zforce    = j->fz;
            tmpData.zpos      = j->zpos;
            tmpData.zconsPos  = j->param.zTargetPos;
            zconsData.push_back(tmpData);
          }

        } else {
          for (int k = 0; k < nFixedZmolsInProc[i]; ++k) {
            MPI_Recv(&zmolIndex, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(data, 3, MPI_REALTYPE, i, 0, MPI_COMM_WORLD, &ierr);
            tmpData.zmolIndex = zmolIndex;
            tmpData.zforce    = data[0];
            tmpData.zpos      = data[1];
            tmpData.zconsPos  = data[2];
            zconsData.push_back(tmpData);
          }
        }
      }

      output_ << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
              << std::endl;
      output_ << zconsData.size() << std::endl;

      std::vector<ZconsData>::iterator l;
      for (l = zconsData.begin(); l != zconsData.end(); ++l) {
        output_ << l->zmolIndex << "\t" << l->zforce << "\t" << l->zpos << "\t"
                << l->zconsPos << std::endl;
      }

    } else {
      std::list<ZconstraintMol>::const_iterator j;
      for (j = fixedZmols.begin(); j != fixedZmols.end(); ++j) {
        zmolIndex = j->mol->getGlobalIndex();
        data[0]   = j->fz;
        data[1]   = j->zpos;
        data[2]   = j->param.zTargetPos;
        MPI_Send(&zmolIndex, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send(data, 3, MPI_REALTYPE, primaryNode, 0, MPI_COMM_WORLD);
      }
    }
#endif
  }